

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O2

void __thiscall Imath_2_5::Matrix44<float>::Matrix44(Matrix44<float> *this,float a)

{
  this->x[0][0] = a;
  this->x[0][1] = a;
  this->x[0][2] = a;
  this->x[0][3] = a;
  this->x[1][0] = a;
  this->x[1][1] = a;
  this->x[1][2] = a;
  this->x[1][3] = a;
  this->x[2][0] = a;
  this->x[2][1] = a;
  this->x[2][2] = a;
  this->x[2][3] = a;
  this->x[3][0] = a;
  this->x[3][1] = a;
  this->x[3][2] = a;
  this->x[3][3] = a;
  return;
}

Assistant:

inline
Matrix44<T>::Matrix44 (T a)
{
    x[0][0] = a;
    x[0][1] = a;
    x[0][2] = a;
    x[0][3] = a;
    x[1][0] = a;
    x[1][1] = a;
    x[1][2] = a;
    x[1][3] = a;
    x[2][0] = a;
    x[2][1] = a;
    x[2][2] = a;
    x[2][3] = a;
    x[3][0] = a;
    x[3][1] = a;
    x[3][2] = a;
    x[3][3] = a;
}